

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

void correct_frames_to_key(AV1_COMP *cpi)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = av1_lookahead_depth(cpi->ppi->lookahead,cpi->compressor_stage);
  iVar3 = av1_lookahead_pop_sz(cpi->ppi->lookahead,cpi->compressor_stage);
  if (((int)uVar2 < iVar3) || (uVar2 = cpi->ppi->frames_left, 0 < (int)uVar2)) {
    uVar1 = (cpi->rc).frames_to_key;
    if ((int)uVar1 < (int)uVar2) {
      uVar2 = uVar1;
    }
    (cpi->rc).frames_to_key = uVar2;
  }
  return;
}

Assistant:

static void correct_frames_to_key(AV1_COMP *cpi) {
  int lookahead_size =
      (int)av1_lookahead_depth(cpi->ppi->lookahead, cpi->compressor_stage);
  if (lookahead_size <
      av1_lookahead_pop_sz(cpi->ppi->lookahead, cpi->compressor_stage)) {
    assert(
        IMPLIES(cpi->oxcf.pass != AOM_RC_ONE_PASS && cpi->ppi->frames_left > 0,
                lookahead_size == cpi->ppi->frames_left));
    cpi->rc.frames_to_key = AOMMIN(cpi->rc.frames_to_key, lookahead_size);
  } else if (cpi->ppi->frames_left > 0) {
    // Correct frames to key based on limit
    cpi->rc.frames_to_key =
        AOMMIN(cpi->rc.frames_to_key, cpi->ppi->frames_left);
  }
}